

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O0

int ipc_get_peer_uid(void *arg,void *buf,size_t *szp,nni_type t)

{
  int fd;
  int local_44;
  int local_40;
  int id;
  int ignore;
  int rv;
  ipc_conn *c;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  local_44 = 0;
  _ignore = arg;
  c._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)buf;
  buf_local = arg;
  fd = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  id = nni_posix_peerid(fd,&local_44,&local_40,&local_40,&local_40);
  arg_local._4_4_ = id;
  if (id == 0) {
    arg_local._4_4_ = nni_copyout_int(local_44,szp_local,psStack_28,c._4_4_);
  }
  return arg_local._4_4_;
}

Assistant:

static int
ipc_get_peer_uid(void *arg, void *buf, size_t *szp, nni_type t)
{
	ipc_conn *c = arg;
	int       rv;
	int       ignore;
	int       id = 0;

	if ((rv = nni_posix_peerid(nni_posix_pfd_fd(&c->pfd), &id, &ignore,
	         &ignore, &ignore)) != 0) {
		return (rv);
	}
	return (nni_copyout_int(id, buf, szp, t));
}